

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O0

void __thiscall
NewSymbolTreeVisitor::PreVisit(NewSymbolTreeVisitor *this,VariableDeclaration *variable_declaration)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  __tuple_element_t<0UL,_tuple<unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>,_unordered_map<Symbol,_shared_ptr<Method>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_shared_ptr<Method>_>_>_>,_unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>_>_>
  *p_Var5;
  mapped_type *pmVar6;
  __tuple_element_t<2UL,_tuple<unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>,_unordered_map<Symbol,_shared_ptr<Method>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_shared_ptr<Method>_>_>_>,_unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>_>_>
  *p_Var7;
  mapped_type *pmVar8;
  runtime_error *prVar9;
  undefined8 local_3e8;
  string local_350;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  _Node_iterator_base<Symbol,_true> local_2b0;
  _Node_iterator_base<Symbol,_true> local_2a8;
  undefined8 local_2a0;
  shared_ptr<PrimitiveArrayObject> local_298;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveArrayObject>_>
  local_288;
  undefined1 local_251;
  string local_250;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  _Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
  local_190;
  _Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
  local_188;
  shared_ptr<PrimitiveSimpleObject> local_180;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveSimpleObject>_>
  local_170;
  undefined1 local_139;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  _Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
  local_78;
  _Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
  local_70 [3];
  string local_58;
  undefined1 local_38 [8];
  Symbol symbol;
  VariableDeclaration *variable_declaration_local;
  NewSymbolTreeVisitor *this_local;
  
  symbol.name_.field_2._8_8_ = variable_declaration;
  std::__cxx11::string::string((string *)&local_58,(string *)&variable_declaration->variable_name_);
  Symbol::Symbol((Symbol *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pcVar3 = (char *)std::__cxx11::string::back();
  if (*pcVar3 == ']') {
    pmVar4 = std::
             unordered_map<Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>_>_>_>
             ::operator[](&(this->tree_).class_symbols_table_,&this->current_layer_->class_symbol_);
    p_Var7 = std::
             get<2ul,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>,std::unordered_map<Symbol,std::shared_ptr<Method>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::shared_ptr<Method>>>>,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>>
                       (pmVar4);
    local_188._M_cur =
         (__node_type *)
         std::
         unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>
         ::find(p_Var7,(key_type *)local_38);
    pmVar4 = std::
             unordered_map<Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>_>_>_>
             ::operator[](&(this->tree_).class_symbols_table_,&this->current_layer_->class_symbol_);
    p_Var7 = std::
             get<2ul,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>,std::unordered_map<Symbol,std::shared_ptr<Method>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::shared_ptr<Method>>>>,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>>
                       (pmVar4);
    local_190._M_cur =
         (__node_type *)
         std::
         unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>
         ::end(p_Var7);
    bVar2 = std::__detail::operator!=(&local_188,&local_190);
    if (bVar2) {
      local_251 = 1;
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      Symbol::GetName_abi_cxx11_(&local_230,&this->current_layer_->class_symbol_);
      std::operator+(&local_210,"In class ",&local_230);
      std::operator+(&local_1f0,&local_210," array ");
      Symbol::GetName_abi_cxx11_(&local_250,(Symbol *)local_38);
      std::operator+(&local_1d0,&local_1f0,&local_250);
      std::operator+(&local_1b0,&local_1d0," has been already declared!");
      std::runtime_error::runtime_error(prVar9,(string *)&local_1b0);
      local_251 = 0;
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar1 = *(long *)(symbol.name_.field_2._8_8_ + 0x10);
    if (*(long *)(symbol.name_.field_2._8_8_ + 0x10) == 0) {
      local_3e8 = 0;
    }
    else {
      local_3e8 = __dynamic_cast(*(long *)(symbol.name_.field_2._8_8_ + 0x10),&Type::typeinfo,
                                 &ArrayType::typeinfo,0);
    }
    local_2a0 = local_3e8;
    std::make_shared<PrimitiveArrayObject,ArrayType*>((ArrayType **)&local_298);
    std::make_pair<std::__cxx11::string&,std::shared_ptr<PrimitiveArrayObject>>
              (&local_288,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar1 + 8),
               &local_298);
    pmVar4 = std::
             unordered_map<Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>_>_>_>
             ::operator[](&(this->tree_).class_symbols_table_,&this->current_layer_->class_symbol_);
    p_Var7 = std::
             get<2ul,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>,std::unordered_map<Symbol,std::shared_ptr<Method>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::shared_ptr<Method>>>>,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>>
                       (pmVar4);
    pmVar6 = std::
             unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>
             ::operator[](p_Var7,(key_type *)local_38);
    std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>::operator=
              ((pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>> *)pmVar6,&local_288);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveArrayObject>_>
    ::~pair(&local_288);
    std::shared_ptr<PrimitiveArrayObject>::~shared_ptr(&local_298);
  }
  else {
    pmVar4 = std::
             unordered_map<Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>_>_>_>
             ::operator[](&(this->tree_).class_symbols_table_,&this->current_layer_->class_symbol_);
    p_Var5 = std::
             get<0ul,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>,std::unordered_map<Symbol,std::shared_ptr<Method>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::shared_ptr<Method>>>>,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>>
                       (pmVar4);
    local_70[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>
         ::find(p_Var5,(key_type *)local_38);
    pmVar4 = std::
             unordered_map<Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>_>_>_>
             ::operator[](&(this->tree_).class_symbols_table_,&this->current_layer_->class_symbol_);
    p_Var5 = std::
             get<0ul,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>,std::unordered_map<Symbol,std::shared_ptr<Method>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::shared_ptr<Method>>>>,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>>
                       (pmVar4);
    local_78._M_cur =
         (__node_type *)
         std::
         unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>
         ::end(p_Var5);
    bVar2 = std::__detail::operator!=(local_70,&local_78);
    if (bVar2) {
      local_139 = 1;
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      Symbol::GetName_abi_cxx11_(&local_118,&this->current_layer_->class_symbol_);
      std::operator+(&local_f8,"In class ",&local_118);
      std::operator+(&local_d8,&local_f8," variable ");
      Symbol::GetName_abi_cxx11_(&local_138,(Symbol *)local_38);
      std::operator+(&local_b8,&local_d8,&local_138);
      std::operator+(&local_98,&local_b8," has been already declared!");
      std::runtime_error::runtime_error(prVar9,(string *)&local_98);
      local_139 = 0;
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar1 = *(long *)(symbol.name_.field_2._8_8_ + 0x10);
    std::make_shared<PrimitiveSimpleObject,Type*&>((Type **)&local_180);
    std::make_pair<std::__cxx11::string&,std::shared_ptr<PrimitiveSimpleObject>>
              (&local_170,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar1 + 8),
               &local_180);
    pmVar4 = std::
             unordered_map<Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>_>_>_>
             ::operator[](&(this->tree_).class_symbols_table_,&this->current_layer_->class_symbol_);
    p_Var5 = std::
             get<0ul,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>,std::unordered_map<Symbol,std::shared_ptr<Method>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::shared_ptr<Method>>>>,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>>
                       (pmVar4);
    pmVar6 = std::
             unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>
             ::operator[](p_Var5,(key_type *)local_38);
    std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>::operator=
              ((pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>> *)pmVar6,&local_170);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveSimpleObject>_>
    ::~pair(&local_170);
    std::shared_ptr<PrimitiveSimpleObject>::~shared_ptr(&local_180);
  }
  pmVar8 = std::
           unordered_map<Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>_>_>
           ::operator[](&(this->tree_).class_members_table_,&this->current_layer_->class_symbol_);
  local_2a8._M_cur =
       (__node_type *)
       std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>
       ::find(pmVar8,(key_type *)local_38);
  pmVar8 = std::
           unordered_map<Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>_>_>
           ::operator[](&(this->tree_).class_members_table_,&this->current_layer_->class_symbol_);
  local_2b0._M_cur =
       (__node_type *)
       std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>
       ::end(pmVar8);
  bVar2 = std::__detail::operator!=(&local_2a8,&local_2b0);
  if (!bVar2) {
    pmVar8 = std::
             unordered_map<Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>_>_>
             ::operator[](&(this->tree_).class_members_table_,&this->current_layer_->class_symbol_);
    std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>::
    insert(pmVar8,(value_type *)local_38);
    Symbol::~Symbol((Symbol *)local_38);
    return;
  }
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  Symbol::GetName_abi_cxx11_(&local_330,&this->current_layer_->class_symbol_);
  std::operator+(&local_310,"In class ",&local_330);
  std::operator+(&local_2f0,&local_310," member duplicate: ");
  Symbol::GetName_abi_cxx11_(&local_350,(Symbol *)local_38);
  std::operator+(&local_2d0,&local_2f0,&local_350);
  std::runtime_error::runtime_error(prVar9,(string *)&local_2d0);
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void NewSymbolTreeVisitor::PreVisit(VariableDeclaration* variable_declaration) {
  Symbol symbol(variable_declaration->variable_name_);
  if (variable_declaration->type_->type_name_.back() != ']') {
    if (std::get<0>(tree_.class_symbols_table_[current_layer_->class_symbol_])
            .find(symbol) !=
        std::get<0>(tree_.class_symbols_table_[current_layer_->class_symbol_])
            .end()) {
      throw std::runtime_error(
          "In class " + current_layer_->class_symbol_.GetName() + " variable " +
          symbol.GetName() + " has been already declared!");
    }

    std::get<0>(
        tree_.class_symbols_table_[current_layer_->class_symbol_])[symbol] =
        std::make_pair(variable_declaration->type_->type_name_,
                       std::make_shared<PrimitiveSimpleObject>(variable_declaration->type_));
  } else {
    if (std::get<2>(tree_.class_symbols_table_[current_layer_->class_symbol_])
            .find(symbol) !=
        std::get<2>(tree_.class_symbols_table_[current_layer_->class_symbol_])
            .end()) {
      throw std::runtime_error(
          "In class " + current_layer_->class_symbol_.GetName() + " array " +
          symbol.GetName() + " has been already declared!");
    }

    std::get<2>(
        tree_.class_symbols_table_[current_layer_->class_symbol_])[symbol] =
        std::make_pair(variable_declaration->type_->type_name_,
                       std::make_shared<PrimitiveArrayObject>(dynamic_cast<ArrayType*>(variable_declaration->type_)));
  }

  if (tree_.class_members_table_[current_layer_->class_symbol_].find(symbol) !=
      tree_.class_members_table_[current_layer_->class_symbol_].end()) {
    throw std::runtime_error("In class " +
                             current_layer_->class_symbol_.GetName() +
                             " member duplicate: " + symbol.GetName());
  }
  tree_.class_members_table_[current_layer_->class_symbol_].insert(symbol);
}